

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::updateCoTest(SPxSolverBase<double> *this)

{
  bool bVar1;
  int n;
  IdxSet *this_00;
  char *pcVar2;
  double *pdVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  SPxSolverBase<double> *in_RDI;
  double dVar6;
  Status stat;
  int j;
  int i;
  double pricingTol;
  Desc *ds;
  IdxSet *idx;
  undefined4 in_stack_ffffffffffffffb8;
  Status in_stack_ffffffffffffffbc;
  SPxSolverBase<double> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_24;
  SPxSolverBase<double> *this_01;
  
  this_01 = in_RDI;
  UpdateVector<double>::delta(in_RDI->theCoPvec);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x27abe8);
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  dVar6 = leavetol((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  IdxSet::clear(&(in_RDI->updateViols).super_IdxSet);
  local_24 = IdxSet::size(this_00);
  uVar5 = extraout_RDX;
  while (local_24 = local_24 - 1, -1 < (int)local_24) {
    pcVar2 = IdxSet::index(this_00,(char *)(ulong)local_24,(int)uVar5);
    n = (int)pcVar2;
    SPxBasisBase<double>::Desc::coStatus
              ((Desc *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    bVar1 = isBasic(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (bVar1) {
      piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,n);
      *piVar4 = 0;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
      ;
      *pdVar3 = 0.0;
      uVar5 = extraout_RDX_06;
    }
    else {
      if (((in_RDI->m_pricingViolUpToDate & 1U) != 0) &&
         (pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc), *pdVar3 < -dVar6)) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc);
        in_RDI->m_pricingViol = *pdVar3 + in_RDI->m_pricingViol;
      }
      in_stack_ffffffffffffffc0 =
           (SPxSolverBase<double> *)coTest(this_01,(int)((ulong)this_00 >> 0x20),(Status)this_00);
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
      ;
      *pdVar3 = (double)in_stack_ffffffffffffffc0;
      if ((in_RDI->sparsePricingEnter & 1U) == 0) {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc);
        uVar5 = extraout_RDX_04;
        if (*pdVar3 < -dVar6) {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc);
          in_RDI->m_pricingViol = in_RDI->m_pricingViol - *pdVar3;
          uVar5 = extraout_RDX_05;
        }
      }
      else {
        pdVar3 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc);
        if (-dVar6 <= *pdVar3) {
          piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,n);
          *piVar4 = 0;
          uVar5 = extraout_RDX_03;
        }
        else {
          pdVar3 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffffc0,
                              in_stack_ffffffffffffffbc);
          in_RDI->m_pricingViol = in_RDI->m_pricingViol - *pdVar3;
          piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,n);
          uVar5 = extraout_RDX_00;
          if (*piVar4 == 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,n);
            *piVar4 = 1;
            uVar5 = extraout_RDX_01;
          }
          if ((in_RDI->hyperPricingEnter & 1U) != 0) {
            DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
            uVar5 = extraout_RDX_02;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateCoTest()
{
   theCoPvec->delta().setup();

   const IdxSet& idx = theCoPvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViols.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolUpToDate && theCoTest[j] < -pricingTol)
            m_pricingViol += theCoTest[j];

         theCoTest[j] = coTest(j, stat);

         if(sparsePricingEnter)
         {
            if(theCoTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnter == 0);
               m_pricingViol -= theCoTest[j];

               if(isInfeasible[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  //                if( !hyperPricingEnter )
                  infeasibilities.addIdx(j);
                  isInfeasible[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViols.addIdx(j);
            }
            else
            {
               // @todo do we need to remove index j from infeasibilitiesCo?
               isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theCoTest[j] < -pricingTol)
            m_pricingViol -= theCoTest[j];
      }
      else
      {
         isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
         theCoTest[j] = 0;
      }
   }
}